

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *file,
          Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  pointer pcVar4;
  int iVar5;
  int iVar6;
  string *extraout_RAX;
  long *plVar7;
  string *extraout_RAX_00;
  undefined8 *puVar8;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string *extraout_RAX_03;
  string *extraout_RAX_04;
  undefined8 uVar9;
  size_type *psVar10;
  long lVar11;
  ulong *puVar12;
  char *__end;
  string *psVar13;
  string segment;
  string result;
  string file_no_suffix;
  string local_100;
  string local_e0;
  string *local_c0;
  _anonymous_namespace_ *local_b8;
  anon_unknown_2 *local_b0;
  string *local_a8;
  anon_unknown_2 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  
  pcVar2 = *(char **)this;
  local_c0 = __return_storage_ptr__;
  local_b8 = this;
  iVar5 = std::__cxx11::string::find_first_of(pcVar2,0x3e5612,0);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"","");
  sVar3 = *(size_t *)(pcVar2 + 8);
  if ((sVar3 != kEmptyFile_abi_cxx11_._M_string_length) ||
     ((psVar13 = &kEmptyMetadataFile_abi_cxx11_, sVar3 != 0 &&
      (iVar6 = bcmp(*(void **)pcVar2,kEmptyFile_abi_cxx11_._M_dataplus._M_p,sVar3), iVar6 != 0)))) {
    if (*file != (FileDescriptor)0x1) {
      local_50._M_allocated_capacity = (size_type)local_40;
      local_50._8_8_ = 0;
      local_40[0] = 0;
      std::__cxx11::string::find_last_of(pcVar2,0x434dd2,0xffffffffffffffff);
      sVar3 = *(size_t *)(pcVar2 + 8);
      if ((sVar3 == kEmptyFile_abi_cxx11_._M_string_length) &&
         ((sVar3 == 0 ||
          (iVar6 = bcmp(*(void **)pcVar2,kEmptyFile_abi_cxx11_._M_dataplus._M_p,sVar3), iVar6 == 0))
         )) {
        (local_c0->_M_dataplus)._M_p = (pointer)&local_c0->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c0,kEmptyMetadataFile_abi_cxx11_._M_dataplus._M_p,
                   kEmptyMetadataFile_abi_cxx11_._M_dataplus._M_p +
                   kEmptyMetadataFile_abi_cxx11_._M_string_length);
        psVar13 = extraout_RAX_00;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_100,(ulong)pcVar2);
        std::__cxx11::string::operator=((string *)local_50._M_local_buf,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        if ((*(byte *)(*(long *)(local_b8 + 0x78) + 0x29) & 1) == 0) {
          std::__cxx11::string::append((char *)&local_90);
          if (iVar5 != -1) {
            paVar1 = &local_e0.field_2;
            do {
              std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_50);
              anon_unknown_2::UnderscoresToCamelCase(&local_100,&local_e0,true);
              std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != paVar1) {
                operator_delete(local_e0._M_dataplus._M_p);
              }
              anon_unknown_2::ReservedNamePrefix
                        ((string *)local_70,local_b0,local_a8,(FileDescriptor *)local_b8);
              plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_70,(ulong)local_b0);
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_e0.field_2._M_allocated_capacity = *psVar10;
                local_e0.field_2._8_8_ = plVar7[3];
                local_e0._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_e0.field_2._M_allocated_capacity = *psVar10;
                local_e0._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_e0._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              psVar10 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_100.field_2._M_allocated_capacity = *psVar10;
                local_100.field_2._8_8_ = plVar7[3];
              }
              else {
                local_100.field_2._M_allocated_capacity = *psVar10;
                local_100._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_100._M_string_length = plVar7[1];
              *plVar7 = (long)psVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_100._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != paVar1) {
                operator_delete(local_e0._M_dataplus._M_p);
              }
              if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
                operator_delete((void *)local_70._0_8_);
              }
              iVar5 = std::__cxx11::string::find_first_of
                                (local_50._M_local_buf,0x3e5612,(long)(iVar5 + 1));
            } while (iVar5 != -1);
          }
        }
        else {
          puVar12 = (ulong *)(*(ulong *)(*(long *)(local_b8 + 0x78) + 0x88) & 0xfffffffffffffffe);
          if ((puVar12[1] != 0) &&
             (iVar5 = std::__cxx11::string::compare((char *)puVar12), iVar5 != 0)) {
            std::__cxx11::string::_M_append((char *)&local_90,*puVar12);
            if (local_88 == 0) {
LAB_00278afe:
              uVar9 = std::__throw_out_of_range_fmt
                                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0xffffffffffffffff,0);
              if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
                operator_delete((void *)local_50._M_allocated_capacity);
              }
              if (local_b0 != local_a0) {
                operator_delete(local_b0);
              }
              if (local_90 != local_80) {
                operator_delete(local_90);
              }
              _Unwind_Resume(uVar9);
            }
            lVar11 = 0;
            do {
              if (local_90[lVar11] == '\\') {
                local_90[lVar11] = 0x2f;
              }
              lVar11 = lVar11 + 1;
            } while (local_88 != lVar11);
            if (local_88 == 0) goto LAB_00278afe;
            if (local_90[local_88 + -1] != '/') {
              std::__cxx11::string::append((char *)&local_90);
            }
          }
        }
        std::__cxx11::string::find_last_of(local_50._M_local_buf,0x3e5612,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)&local_e0,(ulong)&local_50);
        anon_unknown_2::UnderscoresToCamelCase(&local_100,&local_e0,true);
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        psVar13 = local_c0;
        paVar1 = &local_e0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        anon_unknown_2::ReservedNamePrefix
                  ((string *)local_70,local_b0,local_a8,(FileDescriptor *)local_b8);
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,(ulong)local_90);
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_e0.field_2._M_allocated_capacity = *psVar10;
          local_e0.field_2._8_8_ = puVar8[3];
          local_e0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar10;
          local_e0._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_e0._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_b0);
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        psVar10 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_100.field_2._M_allocated_capacity = *psVar10;
          local_100.field_2._8_8_ = puVar8[3];
        }
        else {
          local_100.field_2._M_allocated_capacity = *psVar10;
          local_100._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_100._M_string_length = puVar8[1];
        *puVar8 = psVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
        (psVar13->_M_dataplus)._M_p = (pointer)&psVar13->field_2;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar10) {
          lVar11 = plVar7[3];
          (psVar13->field_2)._M_allocated_capacity = *psVar10;
          *(long *)((long)&psVar13->field_2 + 8) = lVar11;
        }
        else {
          (psVar13->_M_dataplus)._M_p = (pointer)*plVar7;
          (psVar13->field_2)._M_allocated_capacity = *psVar10;
        }
        psVar13->_M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar1) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        psVar13 = (string *)(local_70 + 0x10);
        if ((string *)local_70._0_8_ != psVar13) {
          operator_delete((void *)local_70._0_8_);
          psVar13 = extraout_RAX_01;
        }
      }
      if ((undefined1 *)local_50._M_allocated_capacity != local_40) {
        operator_delete((void *)local_50._M_allocated_capacity);
        psVar13 = extraout_RAX_02;
      }
      goto LAB_00278ace;
    }
    psVar13 = &kDescriptorMetadataFile_abi_cxx11_;
  }
  (local_c0->_M_dataplus)._M_p = (pointer)&local_c0->field_2;
  pcVar4 = (psVar13->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,pcVar4,pcVar4 + psVar13->_M_string_length);
  psVar13 = extraout_RAX;
LAB_00278ace:
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
    psVar13 = extraout_RAX_03;
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
    psVar13 = extraout_RAX_04;
  }
  return psVar13;
}

Assistant:

std::string GeneratedMetadataFileName(const FileDescriptor* file,
                                      const Options& options) {
  const std::string& proto_file = file->name();
  int start_index = 0;
  int first_index = proto_file.find_first_of("/", start_index);
  std::string result = "";
  std::string segment = "";

  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  }
  if (options.is_descriptor) {
    return kDescriptorMetadataFile;
  }

  // Append directory name.
  std::string file_no_suffix;
  int lastindex = proto_file.find_last_of(".");
  if (proto_file == kEmptyFile) {
    return kEmptyMetadataFile;
  } else {
    file_no_suffix = proto_file.substr(0, lastindex);
  }

  if (file->options().has_php_metadata_namespace()) {
    const std::string& php_metadata_namespace =
        file->options().php_metadata_namespace();
    if (!php_metadata_namespace.empty() && php_metadata_namespace != "\\") {
      result += php_metadata_namespace;
      std::replace(result.begin(), result.end(), '\\', '/');
      if (result.at(result.size() - 1) != '/') {
        result += "/";
      }
    }
  } else {
    result += "GPBMetadata/";
    while (first_index != std::string::npos) {
      segment = UnderscoresToCamelCase(
          file_no_suffix.substr(start_index, first_index - start_index), true);
      result += ReservedNamePrefix(segment, file) + segment + "/";
      start_index = first_index + 1;
      first_index = file_no_suffix.find_first_of("/", start_index);
    }
  }

  // Append file name.
  int file_name_start = file_no_suffix.find_last_of("/");
  if (file_name_start == std::string::npos) {
    file_name_start = 0;
  } else {
    file_name_start += 1;
  }
  segment = UnderscoresToCamelCase(
      file_no_suffix.substr(file_name_start, first_index - file_name_start), true);

  return result + ReservedNamePrefix(segment, file) + segment + ".php";
}